

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanosvg.h
# Opt level: O1

char * nsvg__parseNumber(char *s,char *it,int size)

{
  byte *pbVar1;
  char cVar2;
  int iVar3;
  byte bVar4;
  long lVar5;
  
  cVar2 = *s;
  if ((cVar2 == '-') || (iVar3 = 0, cVar2 == '+')) {
    *it = cVar2;
    s = s + 1;
    iVar3 = 1;
  }
  bVar4 = *s;
  if (bVar4 != 0) {
    s = (char *)((byte *)s + 1);
    do {
      if ((byte)(bVar4 - 0x3a) < 0xf6) {
        if (bVar4 == 0x2e) {
          if (iVar3 < 0x3f) {
            lVar5 = (long)iVar3;
            iVar3 = iVar3 + 1;
            it[lVar5] = '.';
          }
          bVar4 = *s;
          while (0xf5 < (byte)(bVar4 - 0x3a)) {
            if (iVar3 < 0x3f) {
              lVar5 = (long)iVar3;
              iVar3 = iVar3 + 1;
              it[lVar5] = bVar4;
            }
            pbVar1 = (byte *)s + 1;
            s = (char *)((byte *)s + 1);
            bVar4 = *pbVar1;
          }
          goto LAB_00116a30;
        }
        break;
      }
      if (iVar3 < 0x3f) {
        lVar5 = (long)iVar3;
        iVar3 = iVar3 + 1;
        it[lVar5] = bVar4;
      }
      bVar4 = *s;
      s = (char *)((byte *)s + 1);
    } while (bVar4 != 0);
    s = (char *)((byte *)s + -1);
  }
LAB_00116a30:
  if ((byte)(*s | 0x20U) == 0x65) {
    if (iVar3 < 0x3f) {
      lVar5 = (long)iVar3;
      iVar3 = iVar3 + 1;
      it[lVar5] = *s;
    }
    bVar4 = ((byte *)s)[1];
    if ((bVar4 == 0x2d) || (bVar4 == 0x2b)) {
      if (iVar3 < 0x3f) {
        lVar5 = (long)iVar3;
        iVar3 = iVar3 + 1;
        it[lVar5] = bVar4;
      }
      s = (char *)((byte *)s + 2);
    }
    else {
      s = (char *)((byte *)s + 1);
    }
    bVar4 = *s;
    while (0xf5 < (byte)(bVar4 - 0x3a)) {
      if (iVar3 < 0x3f) {
        lVar5 = (long)iVar3;
        iVar3 = iVar3 + 1;
        it[lVar5] = bVar4;
      }
      pbVar1 = (byte *)s + 1;
      s = (char *)((byte *)s + 1);
      bVar4 = *pbVar1;
    }
  }
  it[iVar3] = '\0';
  return s;
}

Assistant:

static const char* nsvg__parseNumber(const char* s, char* it, const int size)
{
	const int last = size-1;
	int i = 0;

	// sign
	if (*s == '-' || *s == '+') {
		if (i < last) it[i++] = *s;
		s++;
	}
	// integer part
	while (*s && nsvg__isdigit(*s)) {
		if (i < last) it[i++] = *s;
		s++;
	}
	if (*s == '.') {
		// decimal point
		if (i < last) it[i++] = *s;
		s++;
		// fraction part
		while (*s && nsvg__isdigit(*s)) {
			if (i < last) it[i++] = *s;
			s++;
		}
	}
	// exponent
	if (*s == 'e' || *s == 'E') {
		if (i < last) it[i++] = *s;
		s++;
		if (*s == '-' || *s == '+') {
			if (i < last) it[i++] = *s;
			s++;
		}
		while (*s && nsvg__isdigit(*s)) {
			if (i < last) it[i++] = *s;
			s++;
		}
	}
	it[i] = '\0';

	return s;
}